

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O1

void thread_main(void *arg)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  ulong uVar4;
  char buf [4096];
  undefined1 auStack_1018 [4096];
  
  uv_barrier_wait();
  do {
    do {
      uVar4 = (ulong)*(uint *)((long)arg + 0x20);
      sVar2 = read(*(uint *)((long)arg + 0x20),auStack_1018,0x1000);
    } while (0 < sVar2);
    if (sVar2 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (sVar2 == 0) {
    return;
  }
  thread_main_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(uVar4,0);
  return;
}

Assistant:

static void thread_main(void* arg) {
  int nwritten;
  ASSERT(0 == kill(getpid(), SIGUSR1));

  do
    nwritten = write(pipe_fds[1], test_buf, sizeof(test_buf));
  while (nwritten == -1 && errno == EINTR);

  ASSERT(nwritten == sizeof(test_buf));
}